

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O3

int __thiscall
qclab::qgates::RotationYY<std::complex<double>_>::toQASM
          (RotationYY<std::complex<double>_> *this,ostream *stream,int offset)

{
  int iVar1;
  int iVar2;
  double dVar3;
  vector<int,_std::allocator<int>_> qubits;
  __string_type local_58;
  int *local_38 [2];
  long local_28;
  
  (*(this->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])(local_38,this);
  iVar1 = local_38[0][1];
  iVar2 = *local_38[0];
  dVar3 = atan2((this->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.sin_,
                (this->super_QRotationGate2<std::complex<double>_>).rotation_.angle_.cos_);
  qasm2<double>(&local_58,"ryy",offset + iVar2,iVar1 + offset,dVar3 + dVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] != (int *)0x0) {
    operator_delete(local_38[0],local_28 - (long)local_38[0]);
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          auto qubits = this->qubits() ;
          stream << qasmRyy( qubits[0] + offset ,
                             qubits[1] + offset , this->theta() ) ;
          return 0 ;
        }